

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O2

void dic_delete(dictionary *dic)

{
  keynode *node;
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < dic->length; lVar1 = lVar1 + 1) {
    node = dic->table[lVar1];
    if (node != (keynode *)0x0) {
      keynode_delete(node);
    }
  }
  free(dic->table);
  free(dic);
  return;
}

Assistant:

void dic_delete(struct dictionary* dic) {
	for (int i = 0; i < dic->length; i++) {
		if (dic->table[i])
			keynode_delete(dic->table[i]);
	}
	free(dic->table);
	dic->table = 0;
	free(dic);
}